

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgMatrix.cpp
# Opt level: O3

dgMatrix * __thiscall
dgMatrix::operator*(dgMatrix *__return_storage_ptr__,dgMatrix *this,dgMatrix *B)

{
  float fVar1;
  dgTemplateVector<float> dVar2;
  dgTemplateVector<float> dVar3;
  dgTemplateVector<float> dVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  dgTemplateVector<float> dVar30;
  dgTemplateVector<float> dVar31;
  dgTemplateVector<float> dVar32;
  dgTemplateVector<float> dVar33;
  
  dVar33 = (B->m_up).super_dgTemplateVector<float>;
  dVar2 = (B->m_front).super_dgTemplateVector<float>;
  dVar3 = (B->m_right).super_dgTemplateVector<float>;
  dVar4 = (B->m_posit).super_dgTemplateVector<float>;
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_y;
  auVar29._4_4_ = fVar1;
  auVar29._0_4_ = fVar1;
  auVar29._8_4_ = fVar1;
  auVar29._12_4_ = fVar1;
  auVar29 = vmulps_avx512vl((undefined1  [16])dVar33,auVar29);
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_x;
  auVar5._4_4_ = fVar1;
  auVar5._0_4_ = fVar1;
  auVar5._8_4_ = fVar1;
  auVar5._12_4_ = fVar1;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar2,auVar5);
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_z;
  auVar7._4_4_ = fVar1;
  auVar7._0_4_ = fVar1;
  auVar7._8_4_ = fVar1;
  auVar7._12_4_ = fVar1;
  auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar3,auVar7);
  fVar1 = (this->m_front).super_dgTemplateVector<float>.m_w;
  auVar8._4_4_ = fVar1;
  auVar8._0_4_ = fVar1;
  auVar8._8_4_ = fVar1;
  auVar8._12_4_ = fVar1;
  dVar30 = (dgTemplateVector<float>)vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar4,auVar8);
  auVar9._8_4_ = 0x7fffffff;
  auVar9._0_8_ = 0x7fffffff7fffffff;
  auVar9._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx512vl((undefined1  [16])dVar30,auVar9);
  auVar10._8_4_ = 0x7f7fffff;
  auVar10._0_8_ = 0x7f7fffff7f7fffff;
  auVar10._12_4_ = 0x7f7fffff;
  uVar6 = vpcmpgtd_avx512vl(auVar29,auVar10);
  if (((uVar6 & 0xf) == 0) &&
     (auVar29 = vmovshdup_avx((undefined1  [16])dVar30), !NAN(auVar29._0_4_))) {
    auVar29 = vshufpd_avx((undefined1  [16])dVar30,(undefined1  [16])dVar30,1);
    auVar5 = vshufps_avx((undefined1  [16])dVar30,(undefined1  [16])dVar30,0xff);
    if (!NAN(auVar29._0_4_) && !NAN(auVar5._0_4_)) {
      fVar1 = (this->m_up).super_dgTemplateVector<float>.m_y;
      auVar11._4_4_ = fVar1;
      auVar11._0_4_ = fVar1;
      auVar11._8_4_ = fVar1;
      auVar11._12_4_ = fVar1;
      auVar29 = vmulps_avx512vl((undefined1  [16])dVar33,auVar11);
      fVar1 = (this->m_up).super_dgTemplateVector<float>.m_x;
      auVar12._4_4_ = fVar1;
      auVar12._0_4_ = fVar1;
      auVar12._8_4_ = fVar1;
      auVar12._12_4_ = fVar1;
      auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar2,auVar12);
      fVar1 = (this->m_up).super_dgTemplateVector<float>.m_z;
      auVar13._4_4_ = fVar1;
      auVar13._0_4_ = fVar1;
      auVar13._8_4_ = fVar1;
      auVar13._12_4_ = fVar1;
      auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar3,auVar13);
      fVar1 = (this->m_up).super_dgTemplateVector<float>.m_w;
      auVar14._4_4_ = fVar1;
      auVar14._0_4_ = fVar1;
      auVar14._8_4_ = fVar1;
      auVar14._12_4_ = fVar1;
      dVar31 = (dgTemplateVector<float>)
               vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar4,auVar14);
      auVar15._8_4_ = 0x7fffffff;
      auVar15._0_8_ = 0x7fffffff7fffffff;
      auVar15._12_4_ = 0x7fffffff;
      auVar29 = vandps_avx512vl((undefined1  [16])dVar31,auVar15);
      auVar16._8_4_ = 0x7f7fffff;
      auVar16._0_8_ = 0x7f7fffff7f7fffff;
      auVar16._12_4_ = 0x7f7fffff;
      uVar6 = vpcmpgtd_avx512vl(auVar29,auVar16);
      if (((uVar6 & 0xf) == 0) &&
         (auVar29 = vmovshdup_avx((undefined1  [16])dVar31), !NAN(auVar29._0_4_))) {
        auVar29 = vshufpd_avx((undefined1  [16])dVar31,(undefined1  [16])dVar31,1);
        auVar5 = vshufps_avx((undefined1  [16])dVar31,(undefined1  [16])dVar31,0xff);
        if (!NAN(auVar29._0_4_) && !NAN(auVar5._0_4_)) {
          fVar1 = (this->m_right).super_dgTemplateVector<float>.m_y;
          auVar17._4_4_ = fVar1;
          auVar17._0_4_ = fVar1;
          auVar17._8_4_ = fVar1;
          auVar17._12_4_ = fVar1;
          auVar29 = vmulps_avx512vl((undefined1  [16])dVar33,auVar17);
          fVar1 = (this->m_right).super_dgTemplateVector<float>.m_x;
          auVar18._4_4_ = fVar1;
          auVar18._0_4_ = fVar1;
          auVar18._8_4_ = fVar1;
          auVar18._12_4_ = fVar1;
          auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar2,auVar18);
          fVar1 = (this->m_right).super_dgTemplateVector<float>.m_z;
          auVar19._4_4_ = fVar1;
          auVar19._0_4_ = fVar1;
          auVar19._8_4_ = fVar1;
          auVar19._12_4_ = fVar1;
          auVar29 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar3,auVar19);
          fVar1 = (this->m_right).super_dgTemplateVector<float>.m_w;
          auVar20._4_4_ = fVar1;
          auVar20._0_4_ = fVar1;
          auVar20._8_4_ = fVar1;
          auVar20._12_4_ = fVar1;
          dVar32 = (dgTemplateVector<float>)
                   vfmadd231ps_avx512vl(auVar29,(undefined1  [16])dVar4,auVar20);
          auVar21._8_4_ = 0x7fffffff;
          auVar21._0_8_ = 0x7fffffff7fffffff;
          auVar21._12_4_ = 0x7fffffff;
          auVar29 = vandps_avx512vl((undefined1  [16])dVar32,auVar21);
          auVar22._8_4_ = 0x7f7fffff;
          auVar22._0_8_ = 0x7f7fffff7f7fffff;
          auVar22._12_4_ = 0x7f7fffff;
          uVar6 = vpcmpgtd_avx512vl(auVar29,auVar22);
          if (((uVar6 & 0xf) == 0) &&
             (auVar29 = vmovshdup_avx((undefined1  [16])dVar32), !NAN(auVar29._0_4_))) {
            auVar29 = vshufpd_avx((undefined1  [16])dVar32,(undefined1  [16])dVar32,1);
            auVar5 = vshufps_avx((undefined1  [16])dVar32,(undefined1  [16])dVar32,0xff);
            if (!NAN(auVar29._0_4_) && !NAN(auVar5._0_4_)) {
              fVar1 = (this->m_posit).super_dgTemplateVector<float>.m_y;
              auVar23._4_4_ = fVar1;
              auVar23._0_4_ = fVar1;
              auVar23._8_4_ = fVar1;
              auVar23._12_4_ = fVar1;
              auVar29 = vmulps_avx512vl((undefined1  [16])dVar33,auVar23);
              fVar1 = (this->m_posit).super_dgTemplateVector<float>.m_x;
              auVar24._4_4_ = fVar1;
              auVar24._0_4_ = fVar1;
              auVar24._8_4_ = fVar1;
              auVar24._12_4_ = fVar1;
              auVar29 = vfmadd132ps_avx512vl((undefined1  [16])dVar2,auVar29,auVar24);
              fVar1 = (this->m_posit).super_dgTemplateVector<float>.m_z;
              auVar25._4_4_ = fVar1;
              auVar25._0_4_ = fVar1;
              auVar25._8_4_ = fVar1;
              auVar25._12_4_ = fVar1;
              auVar29 = vfmadd132ps_avx512vl((undefined1  [16])dVar3,auVar29,auVar25);
              fVar1 = (this->m_posit).super_dgTemplateVector<float>.m_w;
              auVar26._4_4_ = fVar1;
              auVar26._0_4_ = fVar1;
              auVar26._8_4_ = fVar1;
              auVar26._12_4_ = fVar1;
              dVar33 = (dgTemplateVector<float>)
                       vfmadd132ps_avx512vl((undefined1  [16])dVar4,auVar29,auVar26);
              auVar27._8_4_ = 0x7fffffff;
              auVar27._0_8_ = 0x7fffffff7fffffff;
              auVar27._12_4_ = 0x7fffffff;
              auVar29 = vandps_avx512vl((undefined1  [16])dVar33,auVar27);
              auVar28._8_4_ = 0x7f7fffff;
              auVar28._0_8_ = 0x7f7fffff7f7fffff;
              auVar28._12_4_ = 0x7f7fffff;
              uVar6 = vpcmpgtd_avx512vl(auVar29,auVar28);
              if (((uVar6 & 0xf) == 0) &&
                 (auVar29 = vmovshdup_avx((undefined1  [16])dVar33), !NAN(auVar29._0_4_))) {
                auVar29 = vshufpd_avx((undefined1  [16])dVar33,(undefined1  [16])dVar33,1);
                auVar5 = vshufps_avx((undefined1  [16])dVar33,(undefined1  [16])dVar33,0xff);
                if (!NAN(auVar29._0_4_) && !NAN(auVar5._0_4_)) {
                  (__return_storage_ptr__->m_front).super_dgTemplateVector<float> = dVar30;
                  (__return_storage_ptr__->m_up).super_dgTemplateVector<float> = dVar31;
                  (__return_storage_ptr__->m_right).super_dgTemplateVector<float> = dVar32;
                  (__return_storage_ptr__->m_posit).super_dgTemplateVector<float> = dVar33;
                  return __return_storage_ptr__;
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("((isfinite((*this)[0]) && !isnan((*this)[0])) && (isfinite((*this)[1]) && !isnan((*this)[1])) && (isfinite((*this)[2]) && !isnan((*this)[2])) && (isfinite((*this)[3]) && !isnan((*this)[3])))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgVector.h"
                ,0x134,"dgVector::dgVector(hacd::HaF32, hacd::HaF32, hacd::HaF32, hacd::HaF32)");
}

Assistant:

dgMatrix dgMatrix::operator* (const dgMatrix &B) const
{
	const dgMatrix& A = *this;
	return dgMatrix (dgVector (A[0][0] * B[0][0] + A[0][1] * B[1][0] + A[0][2] * B[2][0] + A[0][3] * B[3][0],
							   A[0][0] * B[0][1] + A[0][1] * B[1][1] + A[0][2] * B[2][1] + A[0][3] * B[3][1],
							   A[0][0] * B[0][2] + A[0][1] * B[1][2] + A[0][2] * B[2][2] + A[0][3] * B[3][2],
							   A[0][0] * B[0][3] + A[0][1] * B[1][3] + A[0][2] * B[2][3] + A[0][3] * B[3][3]),
					 dgVector (A[1][0] * B[0][0] + A[1][1] * B[1][0] + A[1][2] * B[2][0] + A[1][3] * B[3][0],
							   A[1][0] * B[0][1] + A[1][1] * B[1][1] + A[1][2] * B[2][1] + A[1][3] * B[3][1],
							   A[1][0] * B[0][2] + A[1][1] * B[1][2] + A[1][2] * B[2][2] + A[1][3] * B[3][2],
							   A[1][0] * B[0][3] + A[1][1] * B[1][3] + A[1][2] * B[2][3] + A[1][3] * B[3][3]),
					 dgVector (A[2][0] * B[0][0] + A[2][1] * B[1][0] + A[2][2] * B[2][0] + A[2][3] * B[3][0],
							   A[2][0] * B[0][1] + A[2][1] * B[1][1] + A[2][2] * B[2][1] + A[2][3] * B[3][1],
							   A[2][0] * B[0][2] + A[2][1] * B[1][2] + A[2][2] * B[2][2] + A[2][3] * B[3][2],
							   A[2][0] * B[0][3] + A[2][1] * B[1][3] + A[2][2] * B[2][3] + A[2][3] * B[3][3]),
					 dgVector (A[3][0] * B[0][0] + A[3][1] * B[1][0] + A[3][2] * B[2][0] + A[3][3] * B[3][0],
							   A[3][0] * B[0][1] + A[3][1] * B[1][1] + A[3][2] * B[2][1] + A[3][3] * B[3][1],
							   A[3][0] * B[0][2] + A[3][1] * B[1][2] + A[3][2] * B[2][2] + A[3][3] * B[3][2],
							   A[3][0] * B[0][3] + A[3][1] * B[1][3] + A[3][2] * B[2][3] + A[3][3] * B[3][3]));
}